

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O3

char * ask_user_name(char *szPrompt,char *szDefault)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  char *__s;
  char *pcVar6;
  
  pcVar2 = ask_user_string(szPrompt,szDefault);
  pcVar4 = pcVar2;
  do {
    __s = pcVar4;
    cVar5 = *__s;
    iVar1 = isspace((int)cVar5);
    pcVar6 = __s;
    if (iVar1 == 0) goto LAB_0015bad4;
  } while ((cVar5 != '\0') && (pcVar4 = __s + 1, cVar5 != '\n'));
  goto LAB_0015ba93;
  while( true ) {
    cVar5 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
    iVar1 = isspace((int)cVar5);
    if (iVar1 != 0) break;
LAB_0015bad4:
    if ((cVar5 == '\0') || (cVar5 == '\n')) break;
  }
LAB_0015ba93:
  *pcVar6 = '\0';
  sVar3 = strlen(__s);
  pcVar4 = (char *)operator_new__(sVar3 + 1);
  strcpy(pcVar4,__s);
  operator_delete(pcVar2,1);
  return pcVar4;
}

Assistant:

char*
ask_user_name (const char* szPrompt, const char* szDefault)
{
  char	*szResult = ask_user_string(szPrompt, szDefault);
  char	*s1, *s2, *szNewResult;

  // strip spaces
  s1 = szResult;
  while(isspace(*s1) && '\0' != *s1 && '\n' != *s1)
    ++s1;

  s2 = s1;
  while(!isspace(*s2) && '\0' != *s2 && '\n' != *s2)
    ++s2;
  *s2 = '\0';

  szNewResult = new char[strlen(s1) + 1];
  strcpy(szNewResult, s1);

  delete szResult;

  return szNewResult;
}